

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O2

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::AnyTypeInfo::Deserialize(AnyTypeInfo *this,Deserializer *deserializer)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  AnyTypeInfo *pAVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar3;
  shared_ptr<duckdb::AnyTypeInfo,_true> result;
  
  pAVar2 = (AnyTypeInfo *)operator_new(0x58);
  AnyTypeInfo(pAVar2);
  ::std::__shared_ptr<duckdb::AnyTypeInfo,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::AnyTypeInfo,void>
            ((__shared_ptr<duckdb::AnyTypeInfo,(__gnu_cxx::_Lock_policy)2> *)&result,pAVar2);
  pAVar2 = shared_ptr<duckdb::AnyTypeInfo,_true>::operator->(&result);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,200,"target_type",&pAVar2->target_type);
  pAVar2 = shared_ptr<duckdb::AnyTypeInfo,_true>::operator->(&result);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xc9,"cast_score",&pAVar2->cast_score);
  _Var1 = result.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount;
  result.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       result.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type = _Var1._M_pi;
  result.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &result.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar3.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> AnyTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<AnyTypeInfo>(new AnyTypeInfo());
	deserializer.ReadProperty<LogicalType>(200, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "cast_score", result->cast_score);
	return std::move(result);
}